

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void * WebPSafeMalloc(uint64_t nmemb,size_t size)

{
  undefined1 auVar1 [16];
  void *pvVar2;
  
  if ((nmemb != 0) &&
     (auVar1._8_8_ = 0, auVar1._0_8_ = nmemb,
     SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x400000000)) / auVar1,0) < size)) {
    return (void *)0x0;
  }
  pvVar2 = malloc(size * nmemb);
  return pvVar2;
}

Assistant:

void* WebPSafeMalloc(uint64_t nmemb, size_t size) {
  void* ptr;
  Increment(&num_malloc_calls);
  if (!CheckSizeArgumentsOverflow(nmemb, size)) return NULL;
  assert(nmemb * size > 0);
  ptr = malloc((size_t)(nmemb * size));
  AddMem(ptr, (size_t)(nmemb * size));
  return ptr;
}